

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O1

int runeq(runcxdef *ctx)

{
  byte bVar1;
  runsdef *prVar2;
  anon_union_8_4_1dda36f5_for_runsv __s1;
  anon_union_8_4_1dda36f5_for_runsv __s2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  
  prVar2 = ctx->runcxsp;
  ctx->runcxsp = prVar2 + -1;
  bVar1 = prVar2[-1].runstyp;
  __s1 = prVar2[-1].runsv;
  ctx->runcxsp = prVar2 + -2;
  if (bVar1 == prVar2[-2].runstyp) {
    uVar3 = 1;
    if (0xc < bVar1 - 1) {
      return 1;
    }
    __s2 = prVar2[-2].runsv;
    switch((uint)bVar1) {
    case 1:
      bVar5 = __s1.runsvnum == __s2.runsvnum;
      break;
    case 2:
    case 10:
    case 0xd:
      bVar5 = __s2.runsvobj == __s1.runsvobj;
      break;
    case 3:
    case 7:
      if (*(ushort *)__s1.runsvstr == *(ushort *)__s2.runsvstr) {
        iVar4 = bcmp(__s1.runsvstr,__s2.runsvstr,(ulong)*(ushort *)__s1.runsvstr);
        return (uint)(iVar4 == 0);
      }
      goto LAB_001362b7;
    default:
      goto switchD_00136297_caseD_4;
    }
    uVar3 = (uint)bVar5;
  }
  else {
LAB_001362b7:
    uVar3 = 0;
  }
switchD_00136297_caseD_4:
  return uVar3;
}

Assistant:

int runeq(runcxdef *ctx)
{
    runsdef val1, val2;
    
    /* get values, and see if they have identical type; not equal if not */
    runpop(ctx, &val1);
    runpop(ctx, &val2);
    if (val1.runstyp != val2.runstyp) return(FALSE);
    
    /* types match, so check values */
    switch(val1.runstyp)
    {
    case DAT_NUMBER:
        return(val1.runsv.runsvnum == val2.runsv.runsvnum);
        
    case DAT_SSTRING:
    case DAT_LIST:
        return(osrp2(val1.runsv.runsvstr) == osrp2(val2.runsv.runsvstr)
               && !memcmp(val1.runsv.runsvstr, val2.runsv.runsvstr,
                          (size_t)osrp2(val1.runsv.runsvstr)));
        
    case DAT_PROPNUM:
        return(val1.runsv.runsvprp == val2.runsv.runsvprp);
        
    case DAT_OBJECT:
    case DAT_FNADDR:
        return(val1.runsv.runsvobj == val2.runsv.runsvobj);
        
    default:
        return(TRUE);
    }
}